

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,float Val)

{
  undefined8 in_RAX;
  _func_int **pp_Var1;
  float *ptData;
  float Val_local;
  float tmp;
  
  ptData = &Val_local;
  _Val_local = CONCAT44((float)((ulong)in_RAX >> 0x20),Val);
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    ptData = &tmp;
    _Val_local = CONCAT44(Val,Val);
    StreamSwapBytes<float>(ptData);
    pp_Var1 = (this->super_ChStreamOut)._vptr_ChStreamOut;
  }
  else {
    pp_Var1 = (this->super_ChStreamOut)._vptr_ChStreamOut;
  }
  (*pp_Var1[2])(this,ptData,4);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(const float Val) {
    if (big_endian_machine) {
        float tmp = Val;
        StreamSwapBytes<float>(&tmp);
        this->Output((char*)&tmp, sizeof(float));
    } else {
        this->Output((char*)&Val, sizeof(float));
    }
    return (*this);
}